

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int fits_delete_iraf_file(char *filename,int *status)

{
  char local_138 [8];
  char pixfilename [256];
  int local_2c;
  char *pcStack_28;
  int lenirafhead;
  char *irafheader;
  int *status_local;
  char *filename_local;
  
  irafheader = (char *)status;
  status_local = (int *)filename;
  pcStack_28 = irafrdhead(filename,&local_2c);
  if (pcStack_28 == (char *)0x0) {
    irafheader[0] = 'h';
    irafheader[1] = '\0';
    irafheader[2] = '\0';
    irafheader[3] = '\0';
    filename_local._4_4_ = 0x68;
  }
  else {
    getirafpixname((char *)status_local,pcStack_28,local_138,(int *)irafheader);
    free(pcStack_28);
    if (*(int *)irafheader < 1) {
      remove((char *)status_local);
      remove(local_138);
      filename_local._4_4_ = *(int *)irafheader;
    }
    else {
      filename_local._4_4_ = *(int *)irafheader;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int fits_delete_iraf_file(const char *filename,  /* name of input file      */
             int *status)                        /* IO - error status       */

/*
   Delete the iraf .imh header file and the associated .pix data file
*/
{
    char *irafheader;
    int lenirafhead;

    char pixfilename[SZ_IM2PIXFILE+1];

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    getirafpixname (filename, irafheader, pixfilename, status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    remove(filename);
    remove(pixfilename);
    
    return(*status);
}